

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

void __thiscall MeshLib::Solid::destroyEdge(Solid *this,Edge *edge)

{
  uint __line;
  char *__assertion;
  
  if ((edge->m_halfedge[0] == (HalfEdge *)0x0) && (edge->m_halfedge[1] == (HalfEdge *)0x0)) {
    if (edge->m_trait == (Trait *)0x0) {
      AVL::Tree<MeshLib::Edge>::remove(&this->m_edges,(char *)edge);
      std::__cxx11::string::~string((string *)&edge->m_string);
      operator_delete(edge);
      return;
    }
    __assertion = "edge->trait () == NULL";
    __line = 0x61;
  }
  else {
    __assertion = "edge->halfedge (0) == NULL && edge->halfedge (1) == NULL";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                ,__line,"void MeshLib::Solid::destroyEdge(Edge *)");
}

Assistant:

void Solid::destroyEdge (Edge * edge)
{
	assert(edge->halfedge (0) == NULL && edge->halfedge (1) == NULL);
	assert(edge->trait () == NULL);
	m_edges.remove (edge);
	delete edge;
}